

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  int iVar1;
  rnnvalue **pprVar2;
  rnnvalue *prVar3;
  rnnbitfield **pprVar4;
  rnnbitfield *prVar5;
  int iVar6;
  rnnvalue ***ppprVar7;
  rnnbitfield ***ppprVar8;
  char *pcVar9;
  rnndeccolors *prVar10;
  double dVar11;
  char *pcVar12;
  char **__ptr;
  ulong uVar13;
  char *__fmt;
  int *piVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char *res;
  char *tmp;
  char *local_50;
  char *local_48;
  ulong local_40;
  rnndeccontext *local_38;
  
code_r0x00172e7a:
  uVar18 = value >> 0x20;
  local_50 = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar1 = ti->shr;
    uVar16 = value << ((byte)iVar1 & 0x3f);
    uVar13 = uVar16;
    if (iVar1 == 0) {
      uVar13 = value;
    }
    value = uVar13 & 0xffffffff;
    if (iVar1 != 0) {
      uVar18 = uVar16 >> 0x20;
    }
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar7 = &ti->vals;
      piVar14 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar8 = &ti->bitfields;
      piVar14 = &ti->bitfieldsnum;
      goto LAB_00173045;
    case RNN_TTYPE_ENUM:
      ppprVar7 = &ti->eenum->vals;
      piVar14 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar8 = &ti->ebitset->bitfields;
      piVar14 = &ti->ebitset->bitfieldsnum;
LAB_00173045:
      iVar1 = *piVar14;
      uVar18 = value | uVar18 << 0x20;
      if (0 < (long)iVar1) {
        pprVar4 = *ppprVar8;
        lVar17 = 0;
        uVar13 = 0;
        local_38 = ctx;
        goto LAB_0017306b;
      }
      if (uVar18 != 0) goto LAB_00173285;
      goto LAB_001732b2;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_00172edb_caseD_4;
    case RNN_TTYPE_HEX:
      prVar10 = ctx->colors;
      pcVar12 = (char *)(value | uVar18 << 0x20);
      pcVar15 = prVar10->cimm;
      goto LAB_00172fe4;
    case RNN_TTYPE_INT:
      uVar18 = value | uVar18 << 0x20;
      prVar10 = ctx->colors;
      if ((uVar18 >> ((ulong)(byte)((byte)width - 1) & 0x3f) & 1) == 0) {
        pcVar9 = prVar10->cend;
        pcVar15 = "%s%li%s";
      }
      else {
        uVar18 = (1L << ((byte)width & 0x3f)) - uVar18;
        pcVar9 = prVar10->cend;
        pcVar15 = "%s-%li%s";
      }
      asprintf(&local_50,pcVar15,prVar10->cimm,uVar18,pcVar9);
      return local_50;
    case RNN_TTYPE_UINT:
      pcVar12 = (char *)(value | uVar18 << 0x20);
      pcVar15 = ctx->colors->cimm;
      pcVar9 = ctx->colors->cend;
      __fmt = "%s%lu%s";
      goto LAB_00172fef;
    case RNN_TTYPE_FLOAT:
switchD_00172edb_caseD_8:
      if (width == 0x20) {
        prVar10 = ctx->colors;
        dVar11 = (double)(float)uVar13;
      }
      else {
        if (width != 0x40) goto switchD_00172edb_default;
        prVar10 = ctx->colors;
        dVar11 = (double)(value | uVar18 << 0x20);
      }
      asprintf(&local_50,"%s%f%s",dVar11,prVar10->cimm,prVar10->cend);
      return local_50;
    case RNN_TTYPE_BOOLEAN:
      uVar16 = value | uVar18 << 0x20;
      if (uVar16 == 1) {
        pcVar9 = ctx->colors->cbool;
        pcVar15 = ctx->colors->cend;
        pcVar12 = "%sTRUE%s";
      }
      else {
        if (uVar16 != 0) goto switchD_00172edb_caseD_8;
        pcVar9 = ctx->colors->cbool;
        pcVar15 = ctx->colors->cend;
        pcVar12 = "%sFALSE%s";
      }
      __ptr = &local_50;
      asprintf(__ptr,pcVar12,pcVar9,pcVar15);
      goto LAB_00172ffe;
    default:
      goto switchD_00172edb_default;
    }
    iVar1 = *piVar14;
    if (0 < (long)iVar1) {
      pprVar2 = *ppprVar7;
      local_40 = value | uVar18 << 0x20;
      lVar17 = 0;
      goto LAB_00172f99;
    }
  }
  goto switchD_00172edb_default;
switchD_00172edb_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = value | uVar18 << 0x20;
  goto code_r0x00172e7a;
LAB_0017306b:
  do {
    iVar6 = rnndec_varmatch(ctx,&pprVar4[lVar17]->varinfo);
    if (iVar6 != 0) {
      prVar5 = pprVar4[lVar17];
      uVar16 = (prVar5->mask & uVar18) >> ((byte)prVar5->low & 0x3f);
      uVar13 = uVar13 | prVar5->mask;
      if ((prVar5->typeinfo).type == RNN_TTYPE_BOOLEAN) {
        if (uVar16 != 0) {
          if (uVar16 != 1) goto LAB_001730fa;
          if (local_50 == (char *)0x0) {
            asprintf(&local_50,"%s%s%s",ctx->colors->cbool,prVar5->name,ctx->colors->cend);
          }
          else {
            asprintf(&local_48,"%s | %s%s%s");
            free(local_50);
            local_50 = local_48;
          }
        }
      }
      else {
LAB_001730fa:
        local_40 = uVar13;
        pcVar9 = rnndec_decodeval(ctx,&prVar5->typeinfo,uVar16,(prVar5->high - prVar5->low) + 1);
        if (local_50 == (char *)0x0) {
          asprintf(&local_50,"%s%s%s = %s",ctx->colors->cname,pprVar4[lVar17]->name,
                   ctx->colors->cend,pcVar9);
        }
        else {
          asprintf(&local_48,"%s | %s%s%s = %s");
          free(local_50);
          local_50 = local_48;
        }
        free(pcVar9);
        ctx = local_38;
        uVar13 = local_40;
      }
    }
    lVar17 = lVar17 + 1;
  } while (iVar1 != lVar17);
  uVar18 = uVar18 & ~uVar13;
  if (uVar18 != 0) {
    if (local_50 == (char *)0x0) {
LAB_00173285:
      asprintf(&local_50,"%s%#lx%s",ctx->colors->cerr,uVar18,ctx->colors->cend);
    }
    else {
      asprintf(&local_48,"%s | %s%#lx%s",local_50,ctx->colors->cerr,uVar18,ctx->colors->cend);
      free(local_50);
      local_50 = local_48;
    }
  }
  if (local_50 == (char *)0x0) {
LAB_001732b2:
    asprintf(&local_50,"%s0%s",ctx->colors->cimm,ctx->colors->cend);
  }
  __ptr = &local_48;
  asprintf(__ptr,"{ %s }",local_50);
  free(local_50);
  goto LAB_00172ffe;
  while (lVar17 = lVar17 + 1, iVar1 != lVar17) {
LAB_00172f99:
    iVar6 = rnndec_varmatch(ctx,&pprVar2[lVar17]->varinfo);
    if (((iVar6 != 0) && (prVar3 = pprVar2[lVar17], prVar3->valvalid != 0)) &&
       (prVar3->value == local_40)) {
      pcVar12 = prVar3->name;
      pcVar15 = ctx->colors->ceval;
      pcVar9 = ctx->colors->cend;
      __fmt = "%s%s%s";
      goto LAB_00172fef;
    }
  }
switchD_00172edb_default:
  prVar10 = ctx->colors;
  pcVar12 = (char *)(value & 0xffffffff | uVar18 << 0x20);
  pcVar15 = prVar10->cerr;
LAB_00172fe4:
  pcVar9 = prVar10->cend;
  __fmt = "%s%#lx%s";
LAB_00172fef:
  __ptr = &local_50;
  asprintf(__ptr,__fmt,pcVar15,pcVar12,pcVar9);
LAB_00172ffe:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->ceval, vals[i]->name, ctx->colors->cend);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value & ~mask, ctx->colors->cend);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->cerr, value & ~mask, ctx->colors->cend);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->cimm, ctx->colors->cend);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->cimm, (UINT64_C(1) << width) - value, ctx->colors->cend);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.d, ctx->colors->cend);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.f, ctx->colors->cend);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value, ctx->colors->cend);
			return res;
			break;
	}
}